

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

boolean safe_teleds(boolean allow_drag)

{
  boolean bVar1;
  uint uVar2;
  int x;
  uint uVar3;
  
  uVar3 = 0;
  do {
    uVar2 = mt_random();
    x = uVar2 % 0x4f + 1;
    uVar2 = mt_random();
    bVar1 = teleok(x,uVar2 % 0x15,200 < uVar3);
    if (bVar1 != '\0') {
      teleds(x,uVar2 % 0x15,allow_drag);
      return '\x01';
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x191);
  return '\0';
}

Assistant:

boolean safe_teleds(boolean allow_drag)
{
	int nux, nuy, tcnt = 0;

	do {
		nux = rnd(COLNO-1);
		nuy = rn2(ROWNO);
	} while (!teleok(nux, nuy, (boolean)(tcnt > 200)) && ++tcnt <= 400);

	if (tcnt <= 400) {
		teleds(nux, nuy, allow_drag);
		return TRUE;
	} else
		return FALSE;
}